

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTSnapObjects.h
# Opt level: O3

void TTD::NSSnapObjects::DoAddtlValueInstantiation_SnapArrayInfoCore<double,double>
               (SnapArrayInfo<double> *arrayInfo,JavascriptArray *arrayObj,InflateMap *inflator)

{
  SnapArrayInfoBlock<double> *pSVar1;
  uint32 uVar2;
  uint32 uVar3;
  ulong uVar4;
  double newValue;
  
  for (pSVar1 = arrayInfo->Data; pSVar1 != (SnapArrayInfoBlock<double> *)0x0; pSVar1 = pSVar1->Next)
  {
    uVar2 = pSVar1->FirstIndex;
    uVar3 = pSVar1->LastIndex;
    if (uVar3 != uVar2) {
      uVar4 = 0;
      do {
        if (pSVar1->ArrayValidTags[uVar4] != '\0') {
          newValue = SnapArrayInfo_InflateValue(pSVar1->ArrayRangeContents[uVar4],inflator);
          Js::JavascriptArray::DirectSetItemAt<double>
                    (arrayObj,pSVar1->FirstIndex + (int)uVar4,newValue);
          uVar2 = pSVar1->FirstIndex;
          uVar3 = pSVar1->LastIndex;
        }
        uVar4 = uVar4 + 1;
      } while (uVar4 < uVar3 - uVar2);
    }
  }
  Js::JavascriptArray::SetLength(arrayObj,arrayInfo->Length);
  return;
}

Assistant:

void DoAddtlValueInstantiation_SnapArrayInfoCore(SnapArrayInfo<T>* arrayInfo, Js::JavascriptArray* arrayObj, InflateMap* inflator)
        {
            const SnapArrayInfoBlock<T>* dataBlock = arrayInfo->Data;

            while(dataBlock != nullptr)
            {
                for(uint32 i = 0; i < (dataBlock->LastIndex - dataBlock->FirstIndex); ++i)
                {
                    if(dataBlock->ArrayValidTags[i])
                    {
                        T ttdVal = dataBlock->ArrayRangeContents[i];
                        U jsVal = SnapArrayInfo_InflateValue(ttdVal, inflator);

                        arrayObj->DirectSetItemAt<U>(i + dataBlock->FirstIndex, jsVal);
                    }
                }
                dataBlock = dataBlock->Next;
            }

            //Ensure this value is set correctly in case of sparse arrays
            arrayObj->SetLength(arrayInfo->Length);
        }